

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmCommand * __thiscall cmState::GetCommand(cmState *this,string *name)

{
  cmCommand *pcVar1;
  string local_38;
  string *local_18;
  string *name_local;
  cmState *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  cmsys::SystemTools::LowerCase(&local_38,name);
  pcVar1 = GetCommandByExactName(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pcVar1;
}

Assistant:

cmCommand* cmState::GetCommand(std::string const& name) const
{
  return GetCommandByExactName(cmSystemTools::LowerCase(name));
}